

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# popt.c
# Opt level: O0

char ** poptGetArgs(poptContext con)

{
  poptContext con_local;
  
  if (((con == (poptContext)0x0) || (con->leftovers == (poptArgv)0x0)) ||
     (con->numLeftovers == con->nextLeftover)) {
    con_local = (poptContext)0x0;
  }
  else {
    con->leftovers[con->numLeftovers] = (poptString)0x0;
    con_local = (poptContext)(con->leftovers + con->nextLeftover);
  }
  return (char **)con_local;
}

Assistant:

const char ** poptGetArgs(poptContext con)
{
    if (con == NULL ||
	con->leftovers == NULL || con->numLeftovers == con->nextLeftover)
	return NULL;

    /* some apps like [like RPM ;-) ] need this NULL terminated */
    con->leftovers[con->numLeftovers] = NULL;

    return (con->leftovers + con->nextLeftover);
}